

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

void __thiscall
vkt::Draw::anon_unknown_0::
DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::generateDrawData
          (DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this)

{
  IndexedParamsBase *pIVar1;
  deUint32 dVar2;
  uint uVar3;
  pointer pVVar4;
  uint uVar5;
  uint uVar6;
  deUint32 idx_1;
  ulong uVar7;
  deUint32 idx;
  uint uVar8;
  pointer pPVar9;
  float fVar10;
  float fVar11;
  Random rnd;
  Vector<float,_4> local_e0;
  undefined1 local_d0 [8];
  pointer pPStack_c8;
  pointer pPStack_c0;
  float local_b8;
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *local_a8;
  DrawIndexedIndirectParams *local_a0;
  undefined1 local_98 [16];
  pointer puStack_88;
  deRandom local_78;
  float local_68;
  Vec4 local_58;
  Vec4 local_48;
  
  pVVar4 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  deRandom_init(&local_78,pVVar4->firstIndex ^ pVVar4->indexCount ^ 0xc2a39f);
  uVar5 = 0;
  for (pVVar4 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar4 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    uVar8 = pVVar4->indexCount + pVVar4->firstIndex;
    if (uVar5 < uVar8) {
      uVar5 = uVar8;
    }
  }
  local_d0 = (undefined1  [8])((ulong)(uint)local_d0._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,(ulong)uVar5,
             (value_type_conflict1 *)local_d0,(allocator_type *)&local_e0);
  pIVar1 = &(this->m_data).super_IndexedParamsBase;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pIVar1->indexes,(_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98)
  ;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  uVar5 = 0;
  for (pVVar4 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar4 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    for (uVar8 = 0; uVar8 < pVVar4->indexCount; uVar8 = uVar8 + 1) {
      uVar3 = de::Random::getInt((Random *)&local_78,pVVar4->vertexOffset,10000);
      uVar6 = pVVar4->vertexOffset + uVar3;
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      (pIVar1->indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[pVVar4->firstIndex + uVar8] = uVar3;
    }
  }
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 0.0;
  PositionColorVertex::PositionColorVertex((PositionColorVertex *)local_98,&local_48,&local_58);
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         local_d0,(ulong)(uVar5 + 1),(value_type *)local_98,(allocator_type *)&local_e0);
  local_a0 = &this->m_data;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  _M_move_assign((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)local_a0,
                 (_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  *)local_d0);
  std::_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ::~_Vector_base((_Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                   *)local_d0);
  local_a8 = this;
  for (pVVar4 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar4 != (local_a8->m_data).commands.
                super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    uVar5 = pVVar4->firstIndex;
    dVar2 = pVVar4->indexCount;
    for (uVar7 = (ulong)uVar5; uVar7 < dVar2 + uVar5; uVar7 = uVar7 + 1) {
      pPVar9 = (local_a0->super_DrawParamsBase).vertices.
               super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (long)pVVar4->vertexOffset +
               (ulong)(pIVar1->indexes).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
      local_98._8_4_ = FUNCTION_DRAW;
      local_98._12_4_ = FUNCTION_DRAW_INDEXED;
      puStack_88 = (pointer)0x300000002;
      local_98._0_8_ = pPVar9;
      local_b8 = deRandom_getFloat(&local_78);
      fVar10 = deRandom_getFloat(&local_78);
      local_d0._4_4_ = fVar10 + fVar10 + -1.0;
      local_d0._0_4_ = local_b8 + local_b8 + -1.0;
      pPStack_c8 = (pointer)&DAT_3f8000003f800000;
      tcu::VecAccess<float,_4,_4>::operator=
                ((VecAccess<float,_4,_4> *)local_98,(Vector<float,_4> *)local_d0);
      local_d0 = (undefined1  [8])&pPVar9->color;
      pPStack_c8 = (pointer)0x100000000;
      pPStack_c0 = (pointer)0x300000002;
      local_b8 = deRandom_getFloat(&local_78);
      fVar10 = deRandom_getFloat(&local_78);
      local_68 = deRandom_getFloat(&local_78);
      fVar11 = deRandom_getFloat(&local_78);
      local_e0.m_data[0] = local_b8 + 0.0;
      local_e0.m_data[1] = fVar10 + 0.0;
      local_e0.m_data[3] = fVar11 + 0.0;
      local_e0.m_data[2] = local_68 + 0.0;
      tcu::VecAccess<float,_4,_4>::operator=((VecAccess<float,_4,_4> *)local_d0,&local_e0);
    }
  }
  return;
}

Assistant:

void DrawTestInstance<DrawIndexedIndirectParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.commands[0].firstIndex ^ m_data.commands[0].indexCount);

	deUint32		lastIndex	= 0;

	// Get the maximum range of indexes
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index		= it->firstIndex + it->indexCount;
						lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize the vector with zeros
	m_data.indexes = std::vector<deUint32>(lastIndex, 0);

	deUint32	highestIndex	= 0;

	// Generate random indexes for the ranges
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		for (deUint32 idx = 0; idx < it->indexCount; ++idx)
		{
			const deUint32	vertexIdx	= rnd.getInt(it->vertexOffset, INDEX_LIMIT);
			const deUint32	maxIndex	= vertexIdx + it->vertexOffset;

			highestIndex = (maxIndex > highestIndex) ? maxIndex : highestIndex;
			m_data.indexes[it->firstIndex + idx] = vertexIdx;
		}
	}

	// Initialize the vertex vector
	m_data.vertices = std::vector<PositionColorVertex>(highestIndex + 1, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices in the used locations
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator cmdIt = m_data.commands.begin(); cmdIt != m_data.commands.end(); ++cmdIt)
	{
		deUint32	firstIdx	= cmdIt->firstIndex;
		deUint32	lastIdx		= firstIdx + cmdIt->indexCount;

		for (deUint32 idx = firstIdx; idx < lastIdx; ++idx)
		{
			std::vector<PositionColorVertex>::iterator	vertexIt = m_data.vertices.begin() + cmdIt->vertexOffset + m_data.indexes[idx];

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}